

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

uint __thiscall
pktalloc::CustomBitSet<2048U>::RangePopcount(CustomBitSet<2048U> *this,uint bitStart,uint bitEnd)

{
  int iVar1;
  ulong uVar2;
  uint lastWordBits;
  uint count;
  WordT word;
  uint wordEnd;
  uint wordIndex;
  uint bitEnd_local;
  uint bitStart_local;
  CustomBitSet<2048U> *this_local;
  uint local_24;
  
  if (bitStart < bitEnd) {
    wordIndex = bitStart >> 6;
    uVar2 = *(ulong *)(this + (ulong)wordIndex * 8) >> ((byte)bitStart & 0x3f);
    if (bitEnd >> 6 == wordIndex) {
      local_24 = (uint)POPCOUNT(uVar2 << (0x40 - ((char)bitEnd - (byte)bitStart) & 0x3f));
    }
    else {
      count = (uint)POPCOUNT(uVar2);
      while (wordIndex = wordIndex + 1, wordIndex < bitEnd >> 6) {
        count = (int)POPCOUNT(*(undefined8 *)(this + (ulong)wordIndex * 8)) + count;
      }
      iVar1 = bitEnd + wordIndex * -0x40;
      if (iVar1 != 0) {
        count = (int)POPCOUNT(*(long *)(this + (ulong)wordIndex * 8) << (0x40U - (char)iVar1 & 0x3f)
                             ) + count;
      }
      local_24 = count;
    }
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

unsigned RangePopcount(unsigned bitStart, unsigned bitEnd)
    {
        static_assert(kWordBits == 64, "Update this");

        if (bitStart >= bitEnd) {
            return 0;
        }

        unsigned wordIndex = bitStart / kWordBits;
        const unsigned wordEnd = bitEnd / kWordBits;

        // Eliminate low bits of first word
        WordT word = Words[wordIndex] >> (bitStart % kWordBits);

        // Eliminate high bits of last word if there is just one word
        if (wordEnd == wordIndex) {
            return PopCount64(word << (kWordBits - (bitEnd - bitStart)));
        }

        // Count remainder of first word
        unsigned count = PopCount64(word);

        // Accumulate popcount of full words
        while (++wordIndex < wordEnd) {
            count += PopCount64(Words[wordIndex]);
        }

        // Eliminate high bits of last word if there is one
        const unsigned lastWordBits = bitEnd - wordIndex * kWordBits;
        if (lastWordBits > 0) {
            count += PopCount64(Words[wordIndex] << (kWordBits - lastWordBits));
        }

        return count;
    }